

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O0

int __thiscall
CVmObjFrameRef::set_index_val_q
          (CVmObjFrameRef *this,vm_val_t *new_container,vm_obj_id_t self,vm_val_t *index_val,
          vm_val_t *new_val)

{
  int iVar1;
  undefined4 uVar2;
  vm_frameref_ext *pvVar3;
  vm_val_t *pvVar4;
  int *in_RCX;
  vm_obj_id_t in_EDX;
  vm_val_t *in_RSI;
  CVmObjFrameRef *in_RDI;
  vm_val_t *in_R8;
  int n;
  vm_frameref_ext *ext;
  undefined8 in_stack_ffffffffffffffb8;
  int idx;
  vm_val_t *in_stack_ffffffffffffffc0;
  
  idx = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  pvVar3 = get_ext(in_RDI);
  if (*in_RCX != 7) {
    err_throw(0);
  }
  iVar1 = in_RCX[2];
  if ((-1 < iVar1) && (iVar1 < pvVar3->nlocals + pvVar3->nparams)) {
    if (pvVar3->fp == (vm_val_t *)0x0) {
      pvVar4 = pvVar3->vars + iVar1;
      uVar2 = *(undefined4 *)&in_R8->field_0x4;
      pvVar4->typ = in_R8->typ;
      *(undefined4 *)&pvVar4->field_0x4 = uVar2;
      pvVar4->val = in_R8->val;
    }
    else if (iVar1 < pvVar3->nlocals) {
      pvVar4 = CVmRun::get_local_from_frame(in_R8,idx);
      uVar2 = *(undefined4 *)&in_R8->field_0x4;
      pvVar4->typ = in_R8->typ;
      *(undefined4 *)&pvVar4->field_0x4 = uVar2;
      pvVar4->val = in_R8->val;
    }
    else {
      pvVar4 = CVmRun::get_param_from_frame(in_stack_ffffffffffffffc0,(int)((ulong)in_R8 >> 0x20));
      uVar2 = *(undefined4 *)&in_R8->field_0x4;
      pvVar4->typ = in_R8->typ;
      *(undefined4 *)&pvVar4->field_0x4 = uVar2;
      pvVar4->val = in_R8->val;
    }
    vm_val_t::set_obj(in_RSI,in_EDX);
    return 1;
  }
  err_throw(0);
}

Assistant:

int CVmObjFrameRef::set_index_val_q(VMG_ vm_val_t *new_container,
                                    vm_obj_id_t self,
                                    const vm_val_t *index_val,
                                    const vm_val_t *new_val)
{
    /* get our extension */
    vm_frameref_ext *ext = get_ext();

    /* check the type */
    if (index_val->typ == VM_INT)
    {
        /* 
         *   It's a direct index into the frame.  Make sure the value is in
         *   range.  
         */
        int n = index_val->val.intval;
        if (n < 0 || n >= ext->nlocals + ext->nparams)
            err_throw(VMERR_INDEX_OUT_OF_RANGE);

        /*  
         *   If we have an active stack frame, read the value from the stack;
         *   otherwise read it from the snapshot array.  
         */
        if (ext->fp != 0)
        {
            /* get it from the stack frame */
            if (n < ext->nlocals)
            {
                /* it's in the local variable range */
                *G_interpreter->get_local_from_frame(vmg_ ext->fp, n) =
                    *new_val;
            }
            else
            {
                /* it's in the parameter range */
                *G_interpreter->get_param_from_frame(
                    vmg_ ext->fp, n - ext->nlocals) = *new_val;
            }
        }
        else
        {
            /* there's no frame - get it from the snapshot array */
            ext->vars[n] = *new_val;
        }
    }
    else
    {
        /* invalid index type */
        err_throw(VMERR_INDEX_OUT_OF_RANGE);
    }

    /* the container doesn't change */
    new_container->set_obj(self);

    /* handled */
    return TRUE;
}